

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool S2Loop::HasCrossingRelation(S2Loop *a,S2Loop *b,LoopRelation *relation)

{
  const_reference pvVar1;
  const_reference b_clipped;
  RangeIterator_conflict *target;
  RangeIterator_conflict *this;
  bool bVar2;
  RangeIterator_conflict bi;
  RangeIterator_conflict ai;
  LoopCrosser ab;
  LoopCrosser ba;
  RangeIterator_conflict RStack_2d8;
  RangeIterator_conflict local_288;
  LoopCrosser local_238;
  LoopCrosser local_130;
  
  RangeIterator::RangeIterator((RangeIterator *)&local_288,&a->index_);
  RangeIterator::RangeIterator((RangeIterator *)&RStack_2d8,&b->index_);
  LoopCrosser::LoopCrosser(&local_238,a,b,relation,false);
  LoopCrosser::LoopCrosser(&local_130,b,a,relation,true);
  if ((local_288.it_.super_IteratorBase.id_.id_ & RStack_2d8.it_.super_IteratorBase.id_.id_) !=
      0xffffffffffffffff) {
    do {
      target = &RStack_2d8;
      this = &local_288;
      if ((RStack_2d8.range_min_.id_ <= local_288.range_max_.id_) &&
         (target = &local_288, this = &RStack_2d8,
         local_288.range_min_.id_ <= RStack_2d8.range_max_.id_)) {
        bVar2 = (long)((-local_288.it_.super_IteratorBase.id_.id_ &
                       local_288.it_.super_IteratorBase.id_.id_) -
                      (-RStack_2d8.it_.super_IteratorBase.id_.id_ &
                      RStack_2d8.it_.super_IteratorBase.id_.id_)) < 0;
        if ((-local_288.it_.super_IteratorBase.id_.id_ & local_288.it_.super_IteratorBase.id_.id_)
            == (-RStack_2d8.it_.super_IteratorBase.id_.id_ &
               RStack_2d8.it_.super_IteratorBase.id_.id_) || bVar2) {
          if (bVar2) {
            bVar2 = LoopCrosser::HasCrossingRelation(&local_130,&RStack_2d8,&local_288);
            goto LAB_001fca9f;
          }
          pvVar1 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                   operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *
                              )local_288.it_.super_IteratorBase.cell_._M_b._M_p,0);
          if ((local_238.a_crossing_target_ != (*(uint *)&pvVar1->field_0x4 & 1)) ||
             (pvVar1 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                       operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                   *)RStack_2d8.it_.super_IteratorBase.cell_._M_b._M_p,0),
             local_238.b_crossing_target_ != (*(uint *)&pvVar1->field_0x4 & 1))) {
            pvVar1 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                     operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                 *)local_288.it_.super_IteratorBase.cell_._M_b._M_p,0);
            if ((1 < *(uint *)&pvVar1->field_0x4) &&
               (pvVar1 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                         operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                     *)RStack_2d8.it_.super_IteratorBase.cell_._M_b._M_p,0),
               1 < *(uint *)&pvVar1->field_0x4)) {
              pvVar1 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                       operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                   *)local_288.it_.super_IteratorBase.cell_._M_b._M_p,0);
              b_clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                          operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                      *)RStack_2d8.it_.super_IteratorBase.cell_._M_b._M_p,0);
              bVar2 = LoopCrosser::CellCrossesCell(&local_238,pvVar1,b_clipped);
              if (bVar2) goto LAB_001fcc02;
            }
            MutableS2ShapeIndex::Iterator::Next(&local_288.it_);
            local_288.range_max_.id_ =
                 local_288.it_.super_IteratorBase.id_.id_ - 1 |
                 local_288.it_.super_IteratorBase.id_.id_;
            local_288.range_min_.id_ =
                 local_288.it_.super_IteratorBase.id_.id_ -
                 (~local_288.it_.super_IteratorBase.id_.id_ &
                 local_288.it_.super_IteratorBase.id_.id_ - 1);
            MutableS2ShapeIndex::Iterator::Next(&RStack_2d8.it_);
            RStack_2d8.range_max_.id_ =
                 RStack_2d8.it_.super_IteratorBase.id_.id_ - 1 |
                 RStack_2d8.it_.super_IteratorBase.id_.id_;
            RStack_2d8.range_min_.id_ =
                 RStack_2d8.it_.super_IteratorBase.id_.id_ -
                 (~RStack_2d8.it_.super_IteratorBase.id_.id_ &
                 RStack_2d8.it_.super_IteratorBase.id_.id_ - 1);
            goto LAB_001fca5c;
          }
        }
        else {
          bVar2 = LoopCrosser::HasCrossingRelation(&local_238,&local_288,&RStack_2d8);
LAB_001fca9f:
          if (bVar2 == false) goto LAB_001fca5c;
        }
LAB_001fcc02:
        bVar2 = true;
        goto LAB_001fcbb1;
      }
      RangeIterator::SeekTo((RangeIterator *)this,target);
LAB_001fca5c:
    } while ((RStack_2d8.it_.super_IteratorBase.id_.id_ & local_288.it_.super_IteratorBase.id_.id_)
             != 0xffffffffffffffff);
  }
  bVar2 = false;
LAB_001fcbb1:
  if (local_130.b_cells_.
      super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.b_cells_.
                    super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  S2CrossingEdgeQuery::~S2CrossingEdgeQuery(&local_130.b_query_);
  if (local_238.b_cells_.
      super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.b_cells_.
                    super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  S2CrossingEdgeQuery::~S2CrossingEdgeQuery(&local_238.b_query_);
  return bVar2;
}

Assistant:

bool S2Loop::HasCrossingRelation(const S2Loop& a, const S2Loop& b,
                                            LoopRelation* relation) {
  // We look for S2CellId ranges where the indexes of A and B overlap, and
  // then test those edges for crossings.
  RangeIterator ai(&a.index_), bi(&b.index_);
  LoopCrosser ab(a, b, relation, false);  // Tests edges of A against B
  LoopCrosser ba(b, a, relation, true);   // Tests edges of B against A
  while (!ai.Done() || !bi.Done()) {
    if (ai.range_max() < bi.range_min()) {
      // The A and B cells don't overlap, and A precedes B.
      ai.SeekTo(bi);
    } else if (bi.range_max() < ai.range_min()) {
      // The A and B cells don't overlap, and B precedes A.
      bi.SeekTo(ai);
    } else {
      // One cell contains the other.  Determine which cell is larger.
      int64 ab_relation = ai.id().lsb() - bi.id().lsb();
      if (ab_relation > 0) {
        // A's index cell is larger.
        if (ab.HasCrossingRelation(&ai, &bi)) return true;
      } else if (ab_relation < 0) {
        // B's index cell is larger.
        if (ba.HasCrossingRelation(&bi, &ai)) return true;
      } else {
        // The A and B cells are the same.  Since the two cells have the same
        // center point P, check whether P satisfies the crossing targets.
        if (ai.contains_center() == ab.a_crossing_target() &&
            bi.contains_center() == ab.b_crossing_target()) {
          return true;
        }
        // Otherwise test all the edge crossings directly.
        if (ai.num_edges() > 0 && bi.num_edges() > 0 &&
            ab.CellCrossesCell(ai.clipped(), bi.clipped())) {
          return true;
        }
        ai.Next();
        bi.Next();
      }
    }
  }
  return false;
}